

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O0

Bool Ppmd_RangeDec_Init(CPpmd7z_RangeDec *p)

{
  int iVar1;
  byte bVar2;
  long in_RDI;
  uint i;
  undefined4 local_c;
  
  *(undefined4 *)(in_RDI + 0x24) = 0;
  *(undefined4 *)(in_RDI + 0x20) = 0;
  *(undefined4 *)(in_RDI + 0x18) = 0xffffffff;
  for (local_c = 0; local_c < 4; local_c = local_c + 1) {
    iVar1 = *(int *)(in_RDI + 0x1c);
    bVar2 = (**(code **)(*(long *)(in_RDI + 0x28) + 8))(*(undefined8 *)(in_RDI + 0x28));
    *(uint *)(in_RDI + 0x1c) = iVar1 << 8 | (uint)bVar2;
  }
  return (Bool)(*(int *)(in_RDI + 0x1c) != -1);
}

Assistant:

static Bool Ppmd_RangeDec_Init(CPpmd7z_RangeDec *p)
{
  unsigned i;
  p->Low = p->Bottom = 0;
  p->Range = 0xFFFFFFFF;
  for (i = 0; i < 4; i++)
    p->Code = (p->Code << 8) | p->Stream->Read((void *)p->Stream);
  return (p->Code < 0xFFFFFFFF);
}